

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

ImGuiTableSettings * ImGui::TableGetBoundSettings(ImGuiTable *table)

{
  uint uVar1;
  char *pcVar2;
  ImGuiTableSettings *pIVar3;
  ulong uVar4;
  
  uVar1 = table->SettingsOffset;
  uVar4 = (ulong)uVar1;
  if (uVar4 != 0xffffffff) {
    if (((int)uVar1 < 4) || ((GImGui->SettingsTables).Buf.Size <= (int)uVar1)) {
      __assert_fail("off >= 4 && off < Buf.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_internal.h"
                    ,0x259,
                    "T *ImChunkStream<ImGuiTableSettings>::ptr_from_offset(int) [T = ImGuiTableSettings]"
                   );
    }
    pcVar2 = (GImGui->SettingsTables).Buf.Data;
    if (*(ImGuiID *)(pcVar2 + uVar4) != table->ID) {
      __assert_fail("settings->ID == table->ID",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                    ,0xbd8,"ImGuiTableSettings *ImGui::TableGetBoundSettings(ImGuiTable *)");
    }
    pIVar3 = (ImGuiTableSettings *)(pcVar2 + uVar4);
    if (table->ColumnsCount <= (int)pIVar3->ColumnsCountMax) {
      return pIVar3;
    }
    pIVar3->ID = 0;
  }
  return (ImGuiTableSettings *)0x0;
}

Assistant:

ImGuiTableSettings* ImGui::TableGetBoundSettings(ImGuiTable* table)
{
    if (table->SettingsOffset != -1)
    {
        ImGuiContext& g = *GImGui;
        ImGuiTableSettings* settings = g.SettingsTables.ptr_from_offset(table->SettingsOffset);
        IM_ASSERT(settings->ID == table->ID);
        if (settings->ColumnsCountMax >= table->ColumnsCount)
            return settings; // OK
        settings->ID = 0; // Invalidate storage, we won't fit because of a count change
    }
    return NULL;
}